

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O3

int __kmp_api_omp_get_num_teams_(void)

{
  kmp_info_t *pkVar1;
  int iVar2;
  kmp_team_p *pkVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  
  iVar2 = __kmp_get_global_thread_id_reg();
  pkVar1 = __kmp_threads[iVar2];
  iVar2 = 1;
  if ((pkVar1->th).th_teams_microtask != (microtask_t)0x0) {
    pkVar3 = (pkVar1->th).th_team;
    iVar5 = (pkVar3->t).t_level;
    iVar4 = (pkVar1->th).th_teams_level + 1;
    if (iVar4 < iVar5) {
      do {
        uVar7 = (pkVar3->t).t_serialized;
        uVar6 = uVar7;
        if ((int)uVar7 < 1) {
LAB_0015fdfc:
          pkVar3 = (pkVar3->t).t_parent;
          iVar5 = iVar5 + -1;
        }
        else {
          do {
            uVar7 = uVar6 - 1;
            iVar5 = iVar5 + -1;
            if (uVar6 < 2) break;
            uVar6 = uVar7;
          } while (iVar4 < iVar5);
          if (uVar7 == 0) {
            pkVar3 = (pkVar3->t).t_parent;
            uVar7 = 0;
          }
          else if (iVar4 < iVar5) goto LAB_0015fdfc;
        }
      } while (iVar4 < iVar5);
    }
    else {
      uVar7 = (pkVar3->t).t_serialized;
    }
    if ((int)uVar7 < 2) {
      iVar2 = (((pkVar3->t).t_parent)->t).t_nproc;
    }
  }
  return iVar2;
}

Assistant:

int FTN_STDCALL KMP_EXPAND_NAME(FTN_GET_NUM_TEAMS)(void) {
#ifdef KMP_STUB
  return 1;
#else
  kmp_info_t *thr = __kmp_entry_thread();
  if (thr->th.th_teams_microtask) {
    kmp_team_t *team = thr->th.th_team;
    int tlevel = thr->th.th_teams_level;
    int ii = team->t.t_level; // the level of the teams construct
    int dd = team->t.t_serialized;
    int level = tlevel + 1;
    KMP_DEBUG_ASSERT(ii >= tlevel);
    while (ii > level) {
      for (dd = team->t.t_serialized; (dd > 0) && (ii > level); dd--, ii--) {
      }
      if (team->t.t_serialized && (!dd)) {
        team = team->t.t_parent;
        continue;
      }
      if (ii > level) {
        team = team->t.t_parent;
        ii--;
      }
    }
    if (dd > 1) {
      return 1; // teams region is serialized ( 1 team of 1 thread ).
    } else {
      return team->t.t_parent->t.t_nproc;
    }
  } else {
    return 1;
  }
#endif
}